

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O0

void __thiscall covenant::CFG::stats(CFG *this,ostream *o)

{
  ostream *poVar1;
  size_type sVar2;
  ulong uVar3;
  const_reference pvVar4;
  uint *puVar5;
  ostream *in_RSI;
  long in_RDI;
  uint vv;
  uint max_per_nonterminal;
  uint total_productions;
  float local_3c;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar1 = std::operator<<(in_RSI,"Number of terminals        : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x30));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(local_10,"Number of non-terminals    : ");
  sVar2 = std::
          vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
          ::size((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                  *)(in_RDI + 0x40));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  std::operator<<(poVar1,"\n");
  local_14 = 0;
  local_18 = 0;
  for (local_1c = 0; uVar3 = (ulong)local_1c,
      sVar2 = std::
              vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
              ::size((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                      *)(in_RDI + 0x40)), uVar3 < sVar2; local_1c = local_1c + 1) {
    pvVar4 = std::
             vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
             ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                           *)(in_RDI + 0x40),(ulong)local_1c);
    sVar2 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::size
                      (pvVar4);
    local_14 = local_14 + (int)sVar2;
    pvVar4 = std::
             vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
             ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                           *)(in_RDI + 0x40),(ulong)local_1c);
    sVar2 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::size
                      (pvVar4);
    local_20 = (uint)sVar2;
    puVar5 = std::max<unsigned_int>(&local_18,&local_20);
    local_18 = *puVar5;
  }
  poVar1 = std::operator<<(local_10,"Total number of productions: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  std::operator<<(poVar1,"\n");
  sVar2 = std::
          vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
          ::size((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                  *)(in_RDI + 0x40));
  if (sVar2 != 0) {
    poVar1 = std::operator<<(local_10,"Avg number of productions per non-terminal : ");
    uVar3 = (ulong)local_14;
    sVar2 = std::
            vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
            ::size((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                    *)(in_RDI + 0x40));
    local_3c = (float)sVar2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)uVar3 / local_3c);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(local_10,"Max number of productions per non-terminal : ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::operator<<(poVar1,"\n");
  }
  return;
}

Assistant:

void stats(ostream &o) const
    {
      o << "Number of terminals        : " << alphsz << "\n";
      o << "Number of non-terminals    : " << prods.size () << "\n";

      unsigned total_productions=0;
      unsigned max_per_nonterminal=0;
      for ( unsigned int vv = 0; vv < prods.size(); vv++ )
      {
        total_productions += prods[vv].size();
        max_per_nonterminal = std::max(max_per_nonterminal, 
                                       (unsigned) prods[vv].size ());
      }

      o << "Total number of productions: " << total_productions << "\n";
      if (prods.size() > 0)
      {
        o << "Avg number of productions per non-terminal : " 
          << float(total_productions) / float(prods.size ()) << "\n";
        o << "Max number of productions per non-terminal : " 
          << max_per_nonterminal << "\n";
      }
    }